

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

UBool __thiscall icu_63::NFRule::shouldRollBack(NFRule *this,int64_t number)

{
  int iVar1;
  uint64_t uVar2;
  
  if ((((this->sub1 != (NFSubstitution *)0x0) &&
       (iVar1 = (*(this->sub1->super_UObject)._vptr_UObject[0xe])(), (char)iVar1 != '\0')) ||
      ((this->sub2 != (NFSubstitution *)0x0 &&
       (iVar1 = (*(this->sub2->super_UObject)._vptr_UObject[0xe])(), (char)iVar1 != '\0')))) &&
     (uVar2 = util64_pow(this->radix,this->exponent), number % (long)uVar2 == 0)) {
    return this->baseValue % (long)uVar2 != 0;
  }
  return '\0';
}

Assistant:

UBool
NFRule::shouldRollBack(int64_t number) const
{
    // we roll back if the rule contains a modulus substitution,
    // the number being formatted is an even multiple of the rule's
    // divisor, and the rule's base value is NOT an even multiple
    // of its divisor
    // In other words, if the original description had
    //    100: << hundred[ >>];
    // that expands into
    //    100: << hundred;
    //    101: << hundred >>;
    // internally.  But when we're formatting 200, if we use the rule
    // at 101, which would normally apply, we get "two hundred zero".
    // To prevent this, we roll back and use the rule at 100 instead.
    // This is the logic that makes this happen: the rule at 101 has
    // a modulus substitution, its base value isn't an even multiple
    // of 100, and the value we're trying to format _is_ an even
    // multiple of 100.  This is called the "rollback rule."
    if ((sub1 != NULL && sub1->isModulusSubstitution()) || (sub2 != NULL && sub2->isModulusSubstitution())) {
        int64_t re = util64_pow(radix, exponent);
        return (number % re) == 0 && (baseValue % re) != 0;
    }
    return FALSE;
}